

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dino_utils.c
# Opt level: O1

stack_char_ptr_t * stack_ptr_parse(stack_char_ptr_t *stack,char *data,char *delim)

{
  char *ptr;
  char *local_28;
  char *brkt;
  
  if (stack == (stack_char_ptr_t *)0x0) {
    stack = stack_ptr_alloc(data);
  }
  local_28 = (char *)0x0;
  ptr = strtok_r(stack->data,delim,&local_28);
  if (ptr != (char *)0x0) {
    do {
      stack_ptr_push(stack,ptr);
      ptr = strtok_r((char *)0x0,delim,&local_28);
    } while (ptr != (char *)0x0);
  }
  return stack;
}

Assistant:

stack_char_ptr_t *stack_ptr_parse(stack_char_ptr_t *stack, const char *data, const char *delim) {
    if (NULL == stack) {
        stack = stack_ptr_alloc(data);
    }

    char *brkt = NULL;
    for (char *param = strtok_r(stack->data, delim, &brkt);
         param;
         param = strtok_r(NULL, delim, &brkt)) {
        stack = stack_ptr_push(stack, param);
    }

    return stack;
}